

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp.h
# Opt level: O1

void csp_bind_lambda(CSP *csp,char *name,function<void_(int)> *fn)

{
  size_t sVar1;
  mapped_type *this;
  unique_lock<std::mutex> lock;
  key_type local_50;
  unique_lock<std::mutex> local_30;
  
  if ((name != (char *)0x0 && csp != (CSP *)0x0) &&
     ((fn->super__Function_base)._M_manager != (_Manager_type)0x0)) {
    local_30._M_device = &csp->process_data_mutex;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar1 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar1);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>_>_>_>
           ::operator[](&csp->lambdas,&local_50);
    std::function<void_(int)>::operator=(this,fn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  return;
}

Assistant:

void csp_bind_lambda(CSP* csp, char const*const name, std::function<void(int)> fn)
{
    if (!csp || !name || !fn)
        return;

    // guard against adding processes, or changing them
    std::unique_lock<std::mutex> lock(csp->process_data_mutex);
    csp->lambdas[name] = fn;
}